

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_posix_collate.cpp
# Opt level: O0

void test_one<wchar_t>(locale *l,string *ia,string *ib,int diff)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  undefined8 uVar4;
  collate *pcVar5;
  wchar_t *pwVar6;
  long lVar7;
  long lVar8;
  wchar_t *pwVar9;
  runtime_error *this;
  int in_ECX;
  int iVar10;
  locale *in_RDI;
  collate<wchar_t> *col;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> b;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> a;
  string *in_stack_fffffffffffffb28;
  allocator *s;
  runtime_error *in_stack_fffffffffffffb30;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
  *in_stack_fffffffffffffb50;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
  *in_stack_fffffffffffffb58;
  locale *in_stack_fffffffffffffb60;
  locale *in_stack_fffffffffffffb70;
  string *in_stack_fffffffffffffb78;
  allocator local_229;
  string local_228 [38];
  undefined1 local_202;
  allocator local_201;
  string local_200 [32];
  wstring local_1e0 [32];
  wstring local_1c0 [38];
  undefined1 local_19a;
  allocator local_199;
  string local_198 [32];
  collate *local_178;
  undefined1 local_16a;
  allocator local_169;
  string local_168 [38];
  undefined1 local_142;
  allocator local_141;
  string local_140 [38];
  undefined1 local_11a;
  allocator local_119;
  string local_118 [38];
  undefined1 local_f2;
  allocator local_f1;
  string local_f0 [38];
  undefined1 local_ca;
  allocator local_c9;
  string local_c8 [38];
  undefined1 local_a2;
  allocator local_a1;
  string local_a0 [32];
  locale local_80 [8];
  wstring local_78 [48];
  locale local_48 [8];
  wstring local_40 [36];
  int local_1c;
  locale *local_8;
  
  local_1c = in_ECX;
  local_8 = in_RDI;
  std::locale::locale(local_48,in_RDI);
  to_correct_string<wchar_t>(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
  std::locale::~locale(local_48);
  std::locale::locale(local_80,local_8);
  to_correct_string<wchar_t>(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
  std::locale::~locale(local_80);
  if (local_1c < 0) {
    test_counter = test_counter + 1;
    bVar1 = std::locale::operator()
                      (in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,in_stack_fffffffffffffb50
                      );
    if (!bVar1) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x29);
      poVar3 = std::operator<<(poVar3," l(a,b)");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      iVar10 = error_counter + 1;
      bVar1 = 0x14 < error_counter;
      error_counter = iVar10;
      if (bVar1) {
        local_a2 = 1;
        uVar4 = __cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_a0,"Error limits reached, stopping unit test",&local_a1);
        booster::runtime_error::runtime_error(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
        local_a2 = 0;
        __cxa_throw(uVar4,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
      }
    }
    test_counter = test_counter + 1;
    bVar1 = std::locale::operator()
                      (in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,in_stack_fffffffffffffb50
                      );
    if (bVar1) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x2a);
      poVar3 = std::operator<<(poVar3," !l(b,a)");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      iVar10 = error_counter + 1;
      bVar1 = 0x14 < error_counter;
      error_counter = iVar10;
      if (bVar1) {
        local_ca = 1;
        uVar4 = __cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_c8,"Error limits reached, stopping unit test",&local_c9);
        booster::runtime_error::runtime_error(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
        local_ca = 0;
        __cxa_throw(uVar4,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
      }
    }
  }
  else if (local_1c == 0) {
    test_counter = test_counter + 1;
    bVar1 = std::locale::operator()
                      (in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,in_stack_fffffffffffffb50
                      );
    if (bVar1) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x2d);
      poVar3 = std::operator<<(poVar3," !l(a,b)");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      iVar10 = error_counter + 1;
      bVar1 = 0x14 < error_counter;
      error_counter = iVar10;
      if (bVar1) {
        local_f2 = 1;
        uVar4 = __cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_f0,"Error limits reached, stopping unit test",&local_f1);
        booster::runtime_error::runtime_error(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
        local_f2 = 0;
        __cxa_throw(uVar4,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
      }
    }
    test_counter = test_counter + 1;
    bVar1 = std::locale::operator()
                      (in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,in_stack_fffffffffffffb50
                      );
    if (bVar1) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x2e);
      poVar3 = std::operator<<(poVar3," !l(b,a)");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      iVar10 = error_counter + 1;
      bVar1 = 0x14 < error_counter;
      error_counter = iVar10;
      if (bVar1) {
        local_11a = 1;
        uVar4 = __cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_118,"Error limits reached, stopping unit test",&local_119);
        booster::runtime_error::runtime_error(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
        local_11a = 0;
        __cxa_throw(uVar4,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
      }
    }
  }
  else {
    test_counter = test_counter + 1;
    bVar1 = std::locale::operator()
                      (in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,in_stack_fffffffffffffb50
                      );
    if (bVar1) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x31);
      poVar3 = std::operator<<(poVar3," !l(a,b)");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      iVar10 = error_counter + 1;
      bVar1 = 0x14 < error_counter;
      error_counter = iVar10;
      if (bVar1) {
        local_142 = 1;
        uVar4 = __cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_140,"Error limits reached, stopping unit test",&local_141);
        booster::runtime_error::runtime_error(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
        local_142 = 0;
        __cxa_throw(uVar4,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
      }
    }
    test_counter = test_counter + 1;
    bVar1 = std::locale::operator()
                      (in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,in_stack_fffffffffffffb50
                      );
    if (!bVar1) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x32);
      poVar3 = std::operator<<(poVar3," l(b,a)");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      iVar10 = error_counter + 1;
      bVar1 = 0x14 < error_counter;
      error_counter = iVar10;
      if (bVar1) {
        local_16a = 1;
        uVar4 = __cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_168,"Error limits reached, stopping unit test",&local_169);
        booster::runtime_error::runtime_error(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
        local_16a = 0;
        __cxa_throw(uVar4,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
      }
    }
  }
  pcVar5 = std::use_facet<std::__cxx11::collate<wchar_t>>(local_8);
  iVar10 = local_1c;
  test_counter = test_counter + 1;
  local_178 = pcVar5;
  pwVar6 = (wchar_t *)std::__cxx11::wstring::c_str();
  lVar7 = std::__cxx11::wstring::c_str();
  lVar8 = std::__cxx11::wstring::size();
  pwVar9 = (wchar_t *)std::__cxx11::wstring::c_str();
  std::__cxx11::wstring::c_str();
  std::__cxx11::wstring::size();
  iVar2 = std::__cxx11::collate<wchar_t>::compare
                    ((wchar_t *)pcVar5,pwVar6,(wchar_t *)(lVar7 + lVar8 * 4),pwVar9);
  if (iVar10 != iVar2) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x37);
    poVar3 = std::operator<<(poVar3,
                             " diff == col.compare(a.c_str(),a.c_str()+a.size(),b.c_str(),b.c_str()+b.size())"
                            );
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    iVar10 = error_counter + 1;
    bVar1 = 0x14 < error_counter;
    error_counter = iVar10;
    if (bVar1) {
      local_19a = 1;
      uVar4 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_198,"Error limits reached, stopping unit test",&local_199);
      booster::runtime_error::runtime_error(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
      local_19a = 0;
      __cxa_throw(uVar4,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  iVar10 = local_1c;
  pcVar5 = local_178;
  test_counter = test_counter + 1;
  std::__cxx11::wstring::c_str();
  std::__cxx11::wstring::c_str();
  std::__cxx11::wstring::size();
  std::__cxx11::collate<wchar_t>::transform((wchar_t *)local_1c0,(wchar_t *)pcVar5);
  pcVar5 = local_178;
  std::__cxx11::wstring::c_str();
  std::__cxx11::wstring::c_str();
  std::__cxx11::wstring::size();
  std::__cxx11::collate<wchar_t>::transform((wchar_t *)local_1e0,(wchar_t *)pcVar5);
  iVar2 = std::__cxx11::wstring::compare(local_1c0);
  iVar2 = get_sign(iVar2);
  std::__cxx11::wstring::~wstring(local_1e0);
  std::__cxx11::wstring::~wstring(local_1c0);
  if (iVar10 != iVar2) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x38);
    poVar3 = std::operator<<(poVar3,
                             " diff == get_sign(col.transform(a.c_str(),a.c_str()+a.size()).compare(col.transform(b.c_str(),b.c_str()+b.size())))"
                            );
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    iVar10 = error_counter + 1;
    bVar1 = 0x14 < error_counter;
    error_counter = iVar10;
    if (bVar1) {
      local_202 = 1;
      uVar4 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_200,"Error limits reached, stopping unit test",&local_201);
      booster::runtime_error::runtime_error(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
      local_202 = 0;
      __cxa_throw(uVar4,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  if (local_1c == 0) {
    test_counter = test_counter + 1;
    pcVar5 = local_178;
    pwVar6 = (wchar_t *)std::__cxx11::wstring::c_str();
    std::__cxx11::wstring::c_str();
    std::__cxx11::wstring::size();
    lVar7 = std::__cxx11::collate<wchar_t>::hash((wchar_t *)pcVar5,pwVar6);
    pcVar5 = local_178;
    pwVar6 = (wchar_t *)std::__cxx11::wstring::c_str();
    std::__cxx11::wstring::c_str();
    std::__cxx11::wstring::size();
    lVar8 = std::__cxx11::collate<wchar_t>::hash((wchar_t *)pcVar5,pwVar6);
    if (lVar7 != lVar8) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x3a);
      this = (runtime_error *)
             std::operator<<(poVar3,
                             " col.hash(a.c_str(),a.c_str()+a.size()) == col.hash(b.c_str(),b.c_str()+b.size())"
                            );
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      iVar10 = error_counter + 1;
      bVar1 = 0x14 < error_counter;
      error_counter = iVar10;
      if (bVar1) {
        uVar4 = __cxa_allocate_exception(0x30);
        s = &local_229;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_228,"Error limits reached, stopping unit test",s);
        booster::runtime_error::runtime_error(this,(string *)s);
        __cxa_throw(uVar4,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
      }
    }
  }
  std::__cxx11::wstring::~wstring(local_78);
  std::__cxx11::wstring::~wstring(local_40);
  return;
}

Assistant:

void test_one(std::locale const &l,std::string ia,std::string ib,int diff)
{
    std::basic_string<CharType> a=to_correct_string<CharType>(ia,l);
    std::basic_string<CharType> b=to_correct_string<CharType>(ib,l);
    if(diff < 0) {
        TEST(l(a,b));
        TEST(!l(b,a));
    }
    else if(diff == 0) {
        TEST(!l(a,b));
        TEST(!l(b,a));
    }
    else {
        TEST(!l(a,b));
        TEST(l(b,a));
    }
    
    std::collate<CharType> const &col = std::use_facet<std::collate<CharType> >(l);

    TEST(diff == col.compare(a.c_str(),a.c_str()+a.size(),b.c_str(),b.c_str()+b.size()));
    TEST(diff == get_sign(col.transform(a.c_str(),a.c_str()+a.size()).compare(col.transform(b.c_str(),b.c_str()+b.size()))));
    if(diff == 0) {
        TEST(col.hash(a.c_str(),a.c_str()+a.size()) == col.hash(b.c_str(),b.c_str()+b.size()));
    }
}